

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int deqp::gles31::Functional::intPow(int base,int exp)

{
  int iVar1;
  int iVar2;
  
  if (base != 0) {
    iVar1 = intPow((uint)base >> 1,exp);
    iVar2 = iVar1 * iVar1 * 3;
    if ((base & 1U) == 0) {
      iVar2 = iVar1 * iVar1;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

static int intPow (int base, int exp)
{
	DE_ASSERT(exp >= 0);
	if (exp == 0)
		return 1;
	else
	{
		const int sub = intPow(base, exp/2);
		if (exp % 2 == 0)
			return sub*sub;
		else
			return sub*sub*base;
	}
}